

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

HTTPResponse * processPhp(HTTPResponse *__return_storage_ptr__,HTTPRequest *req)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  undefined8 uVar7;
  string output;
  string headers;
  string fullPath;
  key_type local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  exec_abi_cxx11_(&local_50,"pwd");
  local_50._M_dataplus._M_p[local_50._M_string_length - 1] = '/';
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)(req->filepath)._M_dataplus._M_p);
  setenv("GATEWAY_INTERFACE","CGI/1.1",1);
  setenv("REDIRECT_STATUS","200",1);
  setenv("REQUEST_METHOD",(req->method)._M_dataplus._M_p,1);
  setenv("SCRIPT_FILENAME",local_50._M_dataplus._M_p,1);
  setenv("SCRIPT_NAME",(req->filepath)._M_dataplus._M_p,1);
  setenv("QUERY_STRING",(req->query)._M_dataplus._M_p,1);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Content-Length","");
  this = &req->headers;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this->_M_t,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((_Rb_tree_header *)iVar5._M_node != &(req->headers)._M_t._M_impl.super__Rb_tree_header) {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Content-Type","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this,&local_b0);
    setenv("CONTENT_TYPE",(pmVar6->_M_dataplus)._M_p,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Content-Length","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this,&local_b0);
    setenv("CONTENT_LENGTH",(pmVar6->_M_dataplus)._M_p,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
  }
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&phpInputFileMutex);
  if (iVar4 == 0) {
    paVar2 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"input.txt","");
    writeFile(&local_90,&req->body);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    exec_abi_cxx11_(&local_90,"php-cgi < input.txt");
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&phpInputFileMutex);
    std::__cxx11::string::find((char *)&local_b0,0x108391,0);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_b0);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_b0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_70);
    paVar3 = &local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"OK","");
    HTTPResponse::HTTPResponse(__return_storage_ptr__,200,&local_70,&local_90,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  uVar7 = std::__throw_system_error(iVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

HTTPResponse processPhp(HTTPRequest& req)
{
    std::string fullPath = exec("pwd");
    fullPath.back() = '/';
    fullPath += req.filepath;

    setenv("GATEWAY_INTERFACE", "CGI/1.1", 1);
    setenv("REDIRECT_STATUS", "200", 1);

    setenv("REQUEST_METHOD", req.method.c_str(), 1);
    setenv("SCRIPT_FILENAME", fullPath.c_str(), 1);
    setenv("SCRIPT_NAME", req.filepath.c_str(), 1);
    setenv("QUERY_STRING", req.query.c_str(), 1);

    if (req.headers.find("Content-Length") != req.headers.end())
    {
        setenv("CONTENT_TYPE", req.headers["Content-Type"].c_str(), 1);
        setenv("CONTENT_LENGTH", req.headers["Content-Length"].c_str(), 1);
    }

    string output;
    {
        lock_guard<mutex> guard(phpInputFileMutex);

        writeFile("input.txt", req.body);

        #ifdef USE_PHP_FPM
        output = exec("cgi-fcgi < input.txt -bind -connect /var/run/php/php-fpm.sock");
        #else
        output = exec("php-cgi < input.txt");
        #endif  
    }

    auto pos = output.find("\n");
    string headers = output.substr(0, pos);
    output = output.substr(pos);

    return HTTPResponse(200, "OK", headers, output, true);
}